

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O1

Vec_Ptr_t * temporaryLtlStore(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  
  if ((pNtk == (Abc_Ntk_t *)0x0) || (uVar6 = pNtk->vLtlProperties->nSize, (int)uVar6 < 1)) {
    pVVar4 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    uVar9 = 8;
    if (8 < uVar6) {
      uVar9 = (ulong)uVar6;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = (int)uVar9;
    ppvVar5 = (void **)malloc(uVar9 << 3);
    pVVar4->pArray = ppvVar5;
    pVVar7 = pNtk->vLtlProperties;
    iVar8 = pVVar7->nSize;
    if (0 < iVar8) {
      uVar6 = pVVar4->nCap;
      iVar1 = pVVar4->nSize;
      ppvVar5 = pVVar4->pArray;
      lVar10 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar10];
        if (iVar1 + (int)lVar10 == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,0x80);
            }
            uVar6 = 0x10;
          }
          else {
            uVar3 = uVar6 * 2;
            if (SBORROW4(uVar6,uVar3) != 0 < (int)uVar6) {
              uVar6 = uVar3;
              if (ppvVar5 == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar3 << 3);
              }
              else {
                ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar3 << 3);
              }
            }
          }
        }
        ppvVar5[iVar1 + lVar10] = pvVar2;
        lVar10 = lVar10 + 1;
        pVVar7 = pNtk->vLtlProperties;
        iVar8 = pVVar7->nSize;
      } while (lVar10 < iVar8);
      pVVar4->nSize = iVar1 + (int)lVar10;
      pVVar4->nCap = uVar6;
      pVVar4->pArray = ppvVar5;
    }
    if (pVVar4->nSize != iVar8) {
      __assert_fail("Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioUtil.c"
                    ,199,"Vec_Ptr_t *temporaryLtlStore(Abc_Ntk_t *)");
    }
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t *temporaryLtlStore( Abc_Ntk_t *pNtk )
{
	Vec_Ptr_t *tempStore;
	char *pFormula;
	int i;

	if( pNtk && Vec_PtrSize( pNtk->vLtlProperties ) > 0 )
	{
		tempStore = Vec_PtrAlloc( Vec_PtrSize( pNtk->vLtlProperties ) );
		Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pFormula, i )
			Vec_PtrPush( tempStore, pFormula );
		assert( Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties ) );
		return tempStore;
	}
	else
		return NULL;
}